

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O3

void av1_highbd_dist_wtd_convolve_y_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               InterpFilterParams *filter_params_y,int subpel_y_qn,ConvolveParams *conv_params,
               int bd)

{
  undefined1 (*pauVar1) [16];
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  int iVar8;
  CONV_BUF_TYPE *pCVar9;
  int16_t *piVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  char cVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  uint16_t *puVar25;
  uint uVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  int iVar32;
  uint16_t *puVar33;
  ulong uVar34;
  int iVar35;
  long lVar36;
  undefined2 uVar37;
  long lVar38;
  CONV_BUF_TYPE *pCVar39;
  undefined2 uVar40;
  uint16_t *puVar41;
  CONV_BUF_TYPE *pCVar42;
  uint16_t *puVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [64];
  undefined1 auVar49 [32];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  
  iVar35 = conv_params->round_1 + conv_params->round_0;
  cVar13 = (char)bd - (char)iVar35;
  uVar37 = 0xff;
  if (bd == 0xc) {
    uVar37 = 0xfff;
  }
  uVar40 = 0x3ff;
  if (bd != 10) {
    uVar40 = uVar37;
  }
  if (0 < w) {
    pCVar9 = conv_params->dst;
    iVar32 = (1 << ((byte)conv_params->round_1 & 0x1f)) >> 1;
    uVar34 = (ulong)((subpel_y_qn & 0xfU) * (uint)filter_params_y->taps);
    lVar38 = (long)(int)(((filter_params_y->taps >> 1) - 1) * src_stride);
    auVar44 = ZEXT416(7 - conv_params->round_0);
    iVar2 = conv_params->fwd_offset;
    iVar3 = conv_params->bck_offset;
    uVar4 = conv_params->round_1;
    iVar29 = (1 << (cVar13 + 0xdU & 0x1f)) + (1 << (cVar13 + 0xeU & 0x1f));
    auVar58._4_4_ = iVar29;
    auVar58._0_4_ = iVar29;
    auVar58._8_4_ = iVar29;
    auVar58._12_4_ = iVar29;
    auVar58._16_4_ = iVar29;
    auVar58._20_4_ = iVar29;
    auVar58._24_4_ = iVar29;
    auVar58._28_4_ = iVar29;
    uVar26 = 0xe - iVar35;
    piVar10 = filter_params_y->filter_ptr;
    uVar5 = *(undefined4 *)(piVar10 + uVar34 + 6);
    auVar59._4_4_ = uVar5;
    auVar59._0_4_ = uVar5;
    auVar59._8_4_ = uVar5;
    auVar59._12_4_ = uVar5;
    auVar59._16_4_ = uVar5;
    auVar59._20_4_ = uVar5;
    auVar59._24_4_ = uVar5;
    auVar59._28_4_ = uVar5;
    uVar5 = *(undefined4 *)(piVar10 + uVar34 + 4);
    uVar6 = *(undefined4 *)(piVar10 + uVar34 + 2);
    auVar55._4_4_ = uVar6;
    auVar55._0_4_ = uVar6;
    auVar55._8_4_ = uVar6;
    auVar55._12_4_ = uVar6;
    auVar55._16_4_ = uVar6;
    auVar55._20_4_ = uVar6;
    auVar55._24_4_ = uVar6;
    auVar55._28_4_ = uVar6;
    uVar6 = *(undefined4 *)(piVar10 + uVar34);
    auVar57._4_4_ = uVar6;
    auVar57._0_4_ = uVar6;
    auVar57._8_4_ = uVar6;
    auVar57._12_4_ = uVar6;
    auVar57._16_4_ = uVar6;
    auVar57._20_4_ = uVar6;
    auVar57._24_4_ = uVar6;
    auVar57._28_4_ = uVar6;
    lVar36 = (long)conv_params->dst_stride;
    iVar35 = conv_params->do_average;
    iVar8 = conv_params->use_dist_wtd_comp_avg;
    lVar27 = (long)src_stride;
    iVar29 = ((1 << ((byte)uVar26 & 0x1f)) >> 1) - iVar29;
    lVar30 = (long)dst_stride0;
    lVar31 = 0;
    uVar34 = 0;
    do {
      if (0 < h) {
        pauVar1 = (undefined1 (*) [16])(src + (uVar34 - lVar38));
        auVar45 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 4) * 2);
        auVar7 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 5) * 2);
        auVar62._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar45;
        auVar62._16_16_ = ZEXT116(1) * auVar7;
        auVar50 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 6) * 2);
        auVar56._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar50;
        auVar56._32_32_ = in_ZMM6._32_32_;
        auVar56._16_16_ = ZEXT116(1) * auVar45;
        auVar49._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar7;
        auVar49._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar50;
        auVar54 = vpunpckhwd_avx2(auVar62,auVar49);
        auVar7 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 2) * 2);
        auVar50 = *(undefined1 (*) [16])(*pauVar1 + (long)(src_stride * 3) * 2);
        auVar60._0_16_ = ZEXT116(0) * auVar50 + ZEXT116(1) * auVar7;
        auVar60._16_16_ = ZEXT116(1) * auVar50;
        auVar46._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar50;
        auVar46._16_16_ = ZEXT116(1) * auVar45;
        auVar48 = ZEXT3264(auVar46);
        auVar11 = vpunpckhwd_avx2(auVar60,auVar46);
        auVar45 = *(undefined1 (*) [16])(*pauVar1 + lVar27 * 2);
        auVar53._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * *pauVar1;
        auVar53._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar45;
        auVar51._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar45;
        auVar51._16_16_ = ZEXT116(1) * auVar7;
        auVar47 = vpunpckhwd_avx2(auVar53,auVar51);
        auVar49 = vpunpcklwd_avx2(auVar62,auVar49);
        auVar46 = vpunpcklwd_avx2(auVar60,auVar46);
        auVar62 = vpunpcklwd_avx2(auVar53,auVar51);
        lVar28 = 0;
        puVar25 = src + (src_stride * 7 - lVar38);
        puVar33 = dst0;
        pCVar39 = pCVar9;
        puVar41 = src + (src_stride * 8 - lVar38);
        pCVar42 = pCVar9 + lVar36;
        puVar43 = dst0 + lVar30;
        in_ZMM6 = auVar56;
        do {
          auVar53 = auVar54;
          auVar60 = auVar46;
          auVar46 = auVar49;
          auVar62 = vpmaddwd_avx2(auVar62,auVar57);
          auVar45 = *(undefined1 (*) [16])((long)puVar25 + lVar31);
          auVar54._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * in_ZMM6._0_16_;
          auVar54._16_16_ = ZEXT116(0) * in_ZMM6._16_16_ + ZEXT116(1) * auVar45;
          auVar7 = *(undefined1 (*) [16])((long)puVar41 + lVar31);
          auVar61._0_16_ = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar45;
          auVar61._16_16_ = ZEXT116(1) * auVar7;
          auVar49 = vpunpcklwd_avx2(auVar54,auVar61);
          auVar54 = vpunpckhwd_avx2(auVar54,auVar61);
          auVar51 = vpmaddwd_avx2(auVar60,auVar55);
          auVar62 = vpaddd_avx2(auVar51,auVar62);
          auVar23._4_4_ = uVar5;
          auVar23._0_4_ = uVar5;
          auVar23._8_4_ = uVar5;
          auVar23._12_4_ = uVar5;
          auVar23._16_4_ = uVar5;
          auVar23._20_4_ = uVar5;
          auVar23._24_4_ = uVar5;
          auVar23._28_4_ = uVar5;
          auVar51 = vpmaddwd_avx2(auVar46,auVar23);
          auVar62 = vpaddd_avx2(auVar62,auVar51);
          auVar51 = vpmaddwd_avx2(auVar59,auVar49);
          auVar62 = vpaddd_avx2(auVar62,auVar51);
          auVar62 = vpslld_avx2(auVar62,auVar44);
          auVar12._4_4_ = iVar32;
          auVar12._0_4_ = iVar32;
          auVar12._8_4_ = iVar32;
          auVar12._12_4_ = iVar32;
          auVar12._16_4_ = iVar32;
          auVar12._20_4_ = iVar32;
          auVar12._24_4_ = iVar32;
          auVar12._28_4_ = iVar32;
          auVar62 = vpaddd_avx2(auVar62,auVar12);
          auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar4));
          auVar62 = vpaddd_avx2(auVar58,auVar62);
          if ((long)((ulong)(uint)w - 8) < (long)uVar34) {
            if (iVar35 == 0) {
              auVar47 = vpackusdw_avx2(auVar62,auVar48._0_32_);
              *(long *)((long)pCVar39 + lVar31) = auVar47._0_8_;
              auVar48 = ZEXT1664(auVar47._16_16_);
              *(long *)((long)pCVar42 + lVar31) = auVar47._16_8_;
            }
            else {
              auVar45._8_8_ = 0;
              auVar45._0_8_ = *(ulong *)((long)pCVar42 + lVar31);
              auVar50._8_8_ = 0;
              auVar50._0_8_ = *(ulong *)((long)pCVar39 + lVar31);
              auVar47._0_16_ = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar50;
              auVar47._16_16_ = ZEXT116(1) * auVar45;
              auVar47 = vpunpcklwd_avx2(auVar47,_DAT_005167a0);
              if (iVar8 == 0) {
                auVar47 = vpaddd_avx2(auVar62,auVar47);
                auVar47 = vpsrad_avx2(auVar47,1);
              }
              else {
                auVar16._4_4_ = iVar2;
                auVar16._0_4_ = iVar2;
                auVar16._8_4_ = iVar2;
                auVar16._12_4_ = iVar2;
                auVar16._16_4_ = iVar2;
                auVar16._20_4_ = iVar2;
                auVar16._24_4_ = iVar2;
                auVar16._28_4_ = iVar2;
                auVar47 = vpmulld_avx2(auVar47,auVar16);
                auVar14._4_4_ = iVar3;
                auVar14._0_4_ = iVar3;
                auVar14._8_4_ = iVar3;
                auVar14._12_4_ = iVar3;
                auVar14._16_4_ = iVar3;
                auVar14._20_4_ = iVar3;
                auVar14._24_4_ = iVar3;
                auVar14._28_4_ = iVar3;
                auVar62 = vpmulld_avx2(auVar62,auVar14);
                auVar47 = vpaddd_avx2(auVar47,auVar62);
                auVar47 = vpsrad_avx2(auVar47,4);
              }
              auVar20._4_4_ = iVar29;
              auVar20._0_4_ = iVar29;
              auVar20._8_4_ = iVar29;
              auVar20._12_4_ = iVar29;
              auVar20._16_4_ = iVar29;
              auVar20._20_4_ = iVar29;
              auVar20._24_4_ = iVar29;
              auVar20._28_4_ = iVar29;
              auVar47 = vpaddd_avx2(auVar47,auVar20);
              auVar47 = vpsrad_avx2(auVar47,ZEXT416(uVar26));
              auVar47 = vpackusdw_avx2(auVar47,auVar47);
              auVar18._2_2_ = uVar40;
              auVar18._0_2_ = uVar40;
              auVar18._4_2_ = uVar40;
              auVar18._6_2_ = uVar40;
              auVar18._8_2_ = uVar40;
              auVar18._10_2_ = uVar40;
              auVar18._12_2_ = uVar40;
              auVar18._14_2_ = uVar40;
              auVar18._16_2_ = uVar40;
              auVar18._18_2_ = uVar40;
              auVar18._20_2_ = uVar40;
              auVar18._22_2_ = uVar40;
              auVar18._24_2_ = uVar40;
              auVar18._26_2_ = uVar40;
              auVar18._28_2_ = uVar40;
              auVar18._30_2_ = uVar40;
              auVar47 = vpminsw_avx2(auVar47,auVar18);
              *(long *)((long)puVar33 + lVar31) = auVar47._0_8_;
              auVar48 = ZEXT1664(auVar47._16_16_);
              *(long *)((long)puVar43 + lVar31) = auVar47._16_8_;
            }
          }
          else {
            auVar47 = vpmaddwd_avx2(auVar47,auVar57);
            auVar51 = vpmaddwd_avx2(auVar11,auVar55);
            auVar47 = vpaddd_avx2(auVar51,auVar47);
            auVar24._4_4_ = uVar5;
            auVar24._0_4_ = uVar5;
            auVar24._8_4_ = uVar5;
            auVar24._12_4_ = uVar5;
            auVar24._16_4_ = uVar5;
            auVar24._20_4_ = uVar5;
            auVar24._24_4_ = uVar5;
            auVar24._28_4_ = uVar5;
            auVar51 = vpmaddwd_avx2(auVar53,auVar24);
            auVar47 = vpaddd_avx2(auVar47,auVar51);
            auVar51 = vpmaddwd_avx2(auVar54,auVar59);
            auVar47 = vpaddd_avx2(auVar47,auVar51);
            auVar47 = vpslld_avx2(auVar47,auVar44);
            auVar22._4_4_ = iVar32;
            auVar22._0_4_ = iVar32;
            auVar22._8_4_ = iVar32;
            auVar22._12_4_ = iVar32;
            auVar22._16_4_ = iVar32;
            auVar22._20_4_ = iVar32;
            auVar22._24_4_ = iVar32;
            auVar22._28_4_ = iVar32;
            auVar47 = vpaddd_avx2(auVar47,auVar22);
            auVar47 = vpsrad_avx2(auVar47,ZEXT416(uVar4));
            auVar47 = vpaddd_avx2(auVar58,auVar47);
            if (iVar35 == 0) {
              auVar47 = vpackusdw_avx2(auVar62,auVar47);
              *(undefined1 (*) [16])((long)pCVar39 + lVar31) = auVar47._0_16_;
              *(undefined1 (*) [16])((long)pCVar42 + lVar31) = auVar47._16_16_;
            }
            else {
              auVar52._0_16_ =
                   ZEXT116(0) * *(undefined1 (*) [16])((long)pCVar42 + lVar31) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar39 + lVar31);
              auVar52._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)pCVar42 + lVar31);
              auVar12 = vpunpcklwd_avx2(auVar52,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              auVar51 = vpunpckhwd_avx2(auVar52,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
              if (iVar8 == 0) {
                auVar62 = vpaddd_avx2(auVar62,auVar12);
                auVar62 = vpsrad_avx2(auVar62,1);
                auVar47 = vpaddd_avx2(auVar47,auVar51);
                auVar47 = vpsrad_avx2(auVar47,1);
              }
              else {
                auVar17._4_4_ = iVar2;
                auVar17._0_4_ = iVar2;
                auVar17._8_4_ = iVar2;
                auVar17._12_4_ = iVar2;
                auVar17._16_4_ = iVar2;
                auVar17._20_4_ = iVar2;
                auVar17._24_4_ = iVar2;
                auVar17._28_4_ = iVar2;
                auVar12 = vpmulld_avx2(auVar17,auVar12);
                auVar15._4_4_ = iVar3;
                auVar15._0_4_ = iVar3;
                auVar15._8_4_ = iVar3;
                auVar15._12_4_ = iVar3;
                auVar15._16_4_ = iVar3;
                auVar15._20_4_ = iVar3;
                auVar15._24_4_ = iVar3;
                auVar15._28_4_ = iVar3;
                auVar62 = vpmulld_avx2(auVar62,auVar15);
                auVar62 = vpaddd_avx2(auVar62,auVar12);
                auVar62 = vpsrad_avx2(auVar62,4);
                auVar51 = vpmulld_avx2(auVar17,auVar51);
                auVar47 = vpmulld_avx2(auVar47,auVar15);
                auVar47 = vpaddd_avx2(auVar51,auVar47);
                auVar47 = vpsrad_avx2(auVar47,4);
              }
              auVar21._4_4_ = iVar29;
              auVar21._0_4_ = iVar29;
              auVar21._8_4_ = iVar29;
              auVar21._12_4_ = iVar29;
              auVar21._16_4_ = iVar29;
              auVar21._20_4_ = iVar29;
              auVar21._24_4_ = iVar29;
              auVar21._28_4_ = iVar29;
              auVar62 = vpaddd_avx2(auVar21,auVar62);
              auVar62 = vpsrad_avx2(auVar62,ZEXT416(uVar26));
              auVar47 = vpaddd_avx2(auVar21,auVar47);
              auVar47 = vpsrad_avx2(auVar47,ZEXT416(uVar26));
              auVar47 = vpackusdw_avx2(auVar62,auVar47);
              auVar19._2_2_ = uVar40;
              auVar19._0_2_ = uVar40;
              auVar19._4_2_ = uVar40;
              auVar19._6_2_ = uVar40;
              auVar19._8_2_ = uVar40;
              auVar19._10_2_ = uVar40;
              auVar19._12_2_ = uVar40;
              auVar19._14_2_ = uVar40;
              auVar19._16_2_ = uVar40;
              auVar19._18_2_ = uVar40;
              auVar19._20_2_ = uVar40;
              auVar19._22_2_ = uVar40;
              auVar19._24_2_ = uVar40;
              auVar19._26_2_ = uVar40;
              auVar19._28_2_ = uVar40;
              auVar19._30_2_ = uVar40;
              auVar47 = vpminsw_avx2(auVar47,auVar19);
              *(undefined1 (*) [16])((long)puVar33 + lVar31) = auVar47._0_16_;
              *(undefined1 (*) [16])((long)puVar43 + lVar31) = auVar47._16_16_;
            }
            auVar48 = ZEXT3264(auVar47);
          }
          in_ZMM6 = ZEXT3264(CONCAT1616(ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
                                        ZEXT116(1) * auVar48._0_16_,
                                        ZEXT116(0) * auVar48._0_16_ + ZEXT116(1) * auVar7));
          lVar28 = lVar28 + 2;
          pCVar42 = pCVar42 + lVar36 * 2;
          pCVar39 = pCVar39 + lVar36 * 2;
          puVar43 = puVar43 + lVar30 * 2;
          puVar33 = puVar33 + lVar30 * 2;
          puVar41 = puVar41 + lVar27 * 2;
          puVar25 = puVar25 + lVar27 * 2;
          auVar47 = auVar11;
          auVar62 = auVar60;
          auVar11 = auVar53;
        } while (lVar28 < h);
      }
      uVar34 = uVar34 + 8;
      lVar31 = lVar31 + 0x10;
    } while (uVar34 < (uint)w);
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_y_avx2(
    const uint16_t *src, int src_stride, uint16_t *dst0, int dst_stride0, int w,
    int h, const InterpFilterParams *filter_params_y, const int subpel_y_qn,
    ConvolveParams *conv_params, int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;
  const int fo_vert = filter_params_y->taps / 2 - 1;
  const uint16_t *const src_ptr = src - fo_vert * src_stride;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  int i, j;
  __m256i s[8], coeffs_y[4];
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;

  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i round_const_y =
      _mm256_set1_epi32(((1 << conv_params->round_1) >> 1));
  const __m128i round_shift_y = _mm_cvtsi32_si128(conv_params->round_1);
  const __m128i round_shift_bits = _mm_cvtsi32_si128(bits);

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));
  const __m256i zero = _mm256_setzero_si256();

  prepare_coeffs(filter_params_y, subpel_y_qn, coeffs_y);

  for (j = 0; j < w; j += 8) {
    const uint16_t *data = &src_ptr[j];
    /* Vertical filter */
    {
      __m256i src6;
      __m256i s01 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 0 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          0x20);
      __m256i s12 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 1 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          0x20);
      __m256i s23 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 2 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          0x20);
      __m256i s34 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 3 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          0x20);
      __m256i s45 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 4 * src_stride))),
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          0x20);
      src6 = _mm256_castsi128_si256(
          _mm_loadu_si128((__m128i *)(data + 6 * src_stride)));
      __m256i s56 = _mm256_permute2x128_si256(
          _mm256_castsi128_si256(
              _mm_loadu_si128((__m128i *)(data + 5 * src_stride))),
          src6, 0x20);

      s[0] = _mm256_unpacklo_epi16(s01, s12);
      s[1] = _mm256_unpacklo_epi16(s23, s34);
      s[2] = _mm256_unpacklo_epi16(s45, s56);

      s[4] = _mm256_unpackhi_epi16(s01, s12);
      s[5] = _mm256_unpackhi_epi16(s23, s34);
      s[6] = _mm256_unpackhi_epi16(s45, s56);

      for (i = 0; i < h; i += 2) {
        data = &src_ptr[i * src_stride + j];

        const __m256i s67 = _mm256_permute2x128_si256(
            src6,
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            0x20);

        src6 = _mm256_castsi128_si256(
            _mm_loadu_si128((__m128i *)(data + 8 * src_stride)));

        const __m256i s78 = _mm256_permute2x128_si256(
            _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(data + 7 * src_stride))),
            src6, 0x20);

        s[3] = _mm256_unpacklo_epi16(s67, s78);
        s[7] = _mm256_unpackhi_epi16(s67, s78);

        const __m256i res_a = convolve(s, coeffs_y);

        __m256i res_a_round = _mm256_sll_epi32(res_a, round_shift_bits);
        res_a_round = _mm256_sra_epi32(
            _mm256_add_epi32(res_a_round, round_const_y), round_shift_y);

        __m256i res_unsigned_lo = _mm256_add_epi32(res_a_round, offset_const);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_lo);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          const __m256i res_b = convolve(s + 4, coeffs_y);
          __m256i res_b_round = _mm256_sll_epi32(res_b, round_shift_bits);
          res_b_round = _mm256_sra_epi32(
              _mm256_add_epi32(res_b_round, round_const_y), round_shift_y);

          __m256i res_unsigned_hi = _mm256_add_epi32(res_b_round, offset_const);

          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);
            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            __m256i res_16b =
                _mm256_packus_epi32(res_unsigned_lo, res_unsigned_hi);
            const __m128i res_0 = _mm256_castsi256_si128(res_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
        s[0] = s[1];
        s[1] = s[2];
        s[2] = s[3];

        s[4] = s[5];
        s[5] = s[6];
        s[6] = s[7];
      }
    }
  }
}